

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polylinecurve.cpp
# Opt level: O3

bool __thiscall ON_PolylineCurve::SetDomain(ON_PolylineCurve *this,double t0,double t1)

{
  int iVar1;
  double *pdVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  ON_Interval old_domain;
  ON_Interval new_domain;
  ON_Interval local_50;
  ON_Interval local_40;
  
  iVar1 = (this->m_t).m_count;
  if (1 < iVar1) {
    uVar5 = (ulong)(iVar1 - 1);
    pdVar2 = (this->m_t).m_a;
    dVar6 = *pdVar2;
    if ((dVar6 == t0) && (!NAN(dVar6) && !NAN(t0))) {
      dVar6 = pdVar2[uVar5];
      bVar3 = true;
      if ((dVar6 == t1) && (!NAN(dVar6) && !NAN(t1))) goto LAB_00590364;
    }
    if (t0 < t1) {
      dVar6 = t1;
      (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])(this);
      local_50.m_t[1] = dVar6;
      ON_Interval::ON_Interval(&local_40,t0,t1);
      pdVar2 = (this->m_t).m_a;
      *pdVar2 = t0;
      pdVar2[uVar5] = t1;
      if (iVar1 != 2) {
        uVar4 = 1;
        do {
          dVar6 = ON_Interval::NormalizedParameterAt(&local_50,pdVar2[uVar4]);
          dVar6 = ON_Interval::ParameterAt(&local_40,dVar6);
          pdVar2 = (this->m_t).m_a;
          pdVar2[uVar4] = dVar6;
          uVar4 = uVar4 + 1;
        } while (uVar5 != uVar4);
      }
      bVar3 = true;
      goto LAB_00590364;
    }
  }
  bVar3 = false;
LAB_00590364:
  ON_Curve::DestroyCurveTree(&this->super_ON_Curve);
  return bVar3;
}

Assistant:

bool ON_PolylineCurve::SetDomain( double t0, double t1 )
{
  bool rc = false;
  const int count = m_t.Count()-1;
  if ( count >= 1 )
  {
    if ( t0 == m_t[0] && t1 == m_t[count] )
      rc = true;
    else if ( t0 < t1 ) 
    {
      const ON_Interval old_domain = Domain();
      const ON_Interval new_domain(t0,t1);
      m_t[0] = t0;
      m_t[count] = t1;
      for ( int i = 1; i < count; i++ )
      {
        m_t[i] = new_domain.ParameterAt( old_domain.NormalizedParameterAt(m_t[i]) );
      }      
			rc=true;
    }
  }
	DestroyCurveTree();
  return rc;  
}